

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O2

bool linenoise::linenoiseRaw(char *prompt,string *line)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  char buf [4096];
  
  iVar2 = isatty(0);
  if (iVar2 == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)line);
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar1 = enableRawMode(0);
    if (bVar1) {
      iVar2 = linenoiseEdit(0,1,buf,0x1000,prompt);
      bVar3 = iVar2 == -1;
      if (!bVar3) {
        std::__cxx11::string::assign((char *)line,(ulong)buf);
      }
      disableRawMode(0);
      putchar(10);
    }
  }
  return bVar3;
}

Assistant:

inline bool linenoiseRaw(const char *prompt, std::string& line) {
    bool quit = false;

    if (!isatty(STDIN_FILENO)) {
        /* Not a tty: read from file / pipe. */
        std::getline(std::cin, line);
    } else {
        /* Interactive editing. */
        if (enableRawMode(STDIN_FILENO) == false) {
            return quit;
        }

        char buf[LINENOISE_MAX_LINE];
        auto count = linenoiseEdit(STDIN_FILENO, STDOUT_FILENO, buf, LINENOISE_MAX_LINE, prompt);
        if (count == -1) {
            quit = true;
        } else {
            line.assign(buf, count);
        }

        disableRawMode(STDIN_FILENO);
        printf("\n");
    }
    return quit;
}